

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::pumpTo
          (PromisedAsyncIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  SourceLocation location;
  AsyncInputStream AVar2;
  void *pvVar3;
  ForkHub<kj::_::Void> *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  ForkedPromise<void> local_80;
  code *local_70;
  AsyncInputStream local_68;
  anon_class_24_3_31b3e6fc_for_func local_60;
  undefined *local_48;
  undefined *puStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  pp_Var1 = output[6]._vptr_AsyncOutputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    ForkedPromise<void>::addBranch(&local_80);
    local_70 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2401:39)>
               ::anon_class_24_3_31b3e6fc_for_func::operator();
    pp_Var1 = local_80.hub.disposer[1]._vptr_Disposer;
    local_60.this = (PromisedAsyncIoStream *)output;
    local_60.output = (AsyncOutputStream *)amount;
    if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_80.hub.disposer - (long)pp_Var1) < 0x38)
    {
      pvVar3 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar3 + 0x3c8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2401:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80,
                 &local_60,&local_70);
      *(void **)((long)pvVar3 + 0x3d0) = pvVar3;
    }
    else {
      local_80.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_80.hub.disposer + -7);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2401:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80,
                 &local_60,&local_70);
      local_80.hub.disposer[-6]._vptr_Disposer = pp_Var1;
    }
    local_48 = &DAT_0042a172;
    puStack_40 = &DAT_0042a1d1;
    local_38 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_80.hub.ptr = location_00;
    kj::_::maybeChain<unsigned_long>
              ((OwnPromiseNode *)&local_68,(Promise<unsigned_long> *)&local_80.hub.ptr,location);
    AVar2._vptr_AsyncInputStream = local_68._vptr_AsyncInputStream;
    local_68._vptr_AsyncInputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         AVar2._vptr_AsyncInputStream;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80.hub.ptr);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_80);
  }
  else {
    (**(code **)(*pp_Var1 + 0x18))(this,pp_Var1,amount);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_SOME(s, stream) {
      return s->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }